

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeNext(BtCursor *pCur)

{
  short sVar1;
  int iVar2;
  byte *in_RDI;
  MemPage *pPage;
  int idx;
  int rc;
  BtCursor *in_stack_ffffffffffffffc8;
  BtCursor *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  BtCursor *pCur_00;
  int local_4;
  
  if (*in_RDI != 0) {
    if (*in_RDI < 3) {
      iVar2 = 0;
    }
    else {
      iVar2 = btreeRestoreCursorPosition(in_stack_ffffffffffffffd0);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (*in_RDI == 1) {
      return 0x65;
    }
    if ((*in_RDI == 2) && (*in_RDI = 0, 0 < *(int *)(in_RDI + 4))) {
      return 0;
    }
    in_stack_ffffffffffffffdc = 0;
  }
  pCur_00 = *(BtCursor **)(in_RDI + 0x88);
  sVar1 = *(short *)(in_RDI + 0x56);
  *(ushort *)(in_RDI + 0x56) = sVar1 + 1U;
  iVar2 = sqlite3FaultSim((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (iVar2 != 0) {
    pCur_00->eState = '\0';
  }
  if (pCur_00->eState == '\0') {
    local_4 = sqlite3CorruptError(0);
  }
  else if ((ushort)(sVar1 + 1U) < *(ushort *)&pCur_00->pKey) {
    if (*(char *)&pCur_00->pBtree == '\0') {
      local_4 = moveToLeftmost(pCur_00);
    }
    else {
      local_4 = 0;
    }
  }
  else if (*(char *)&pCur_00->pBtree == '\0') {
    sqlite3Get4byte((u8 *)(*(long *)&pCur_00->pgnoRoot +
                          (long)(int)(*(byte *)((long)&pCur_00->pBtree + 1) + 8)));
    local_4 = moveToChild(in_stack_ffffffffffffffc8,0);
    if (local_4 == 0) {
      local_4 = moveToLeftmost(pCur_00);
    }
  }
  else {
    do {
      if (in_RDI[0x54] == 0) {
        *in_RDI = 1;
        return 0x65;
      }
      moveToParent(in_stack_ffffffffffffffd0);
    } while (*(ushort *)(*(long *)(in_RDI + 0x88) + 0x18) <= *(ushort *)(in_RDI + 0x56));
    if (*(char *)(*(long *)(in_RDI + 0x88) + 1) == '\0') {
      local_4 = 0;
    }
    else {
      local_4 = sqlite3BtreeNext((BtCursor *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( sqlite3FaultSim(412) ) pPage->isInit = 0;
  if( !pPage->isInit ){
    return SQLITE_CORRUPT_BKPT;
  }

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}